

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void reviseTimeZone(QDateTimeData *d,QTimeZone *zone,TransitionResolution resolve)

{
  QDateTimePrivate *pQVar1;
  QDateTimePrivate *pQVar2;
  undefined8 uVar3;
  QDateTimePrivate *pQVar4;
  byte bVar5;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar8 = (int)(zone->d).d - 1U & 3;
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar6 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar6 = (uint)(byte)pQVar1;
  }
  if (uVar8 == 3) {
    iVar7 = 0;
    bVar5 = 0;
  }
  else if (uVar8 == 2) {
    bVar5 = 0;
    iVar7 = (int)((ulong)(zone->d).d >> 2);
  }
  else {
    bVar5 = (byte)pQVar1 & 1;
    iVar7 = 0;
  }
  if (bVar5 != 0) {
    *(byte *)d = (byte)uVar6 & 7 | (byte)(uVar8 << 4);
    goto LAB_0012d805;
  }
  if (((ulong)pQVar1 & 1) == 0) {
    if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      pQVar4 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar3 = *(undefined8 *)((long)&pQVar1->m_msecs + 4);
      *(undefined8 *)&pQVar4->m_status = *(undefined8 *)&pQVar1->m_status;
      *(undefined8 *)((long)&pQVar4->m_msecs + 4) = uVar3;
      QTimeZone::QTimeZone(&pQVar4->m_timeZone,&pQVar1->m_timeZone);
      goto LAB_0012d7b2;
    }
  }
  else {
    pQVar4 = (QDateTimePrivate *)operator_new(0x20);
    pQVar4->super_QSharedData = (QAtomicInt)0x0;
    pQVar4->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
    pQVar4->m_msecs = 0;
    pQVar4->m_offsetFromUtc = 0;
    QTimeZone::QTimeZone(&pQVar4->m_timeZone);
    pQVar2 = d->d;
    (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (int)(char)pQVar2 & 0xfffffffe;
    pQVar4->m_msecs = (long)pQVar2 >> 8;
LAB_0012d7b2:
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 1;
    if (((ulong)pQVar1 & 1) == 0) {
      pQVar1 = d->d;
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i == 0) &&
         (pQVar1 = d->d, pQVar1 != (QDateTimePrivate *)0x0)) {
        QTimeZone::~QTimeZone(&pQVar1->m_timeZone);
        operator_delete(pQVar1,0x20);
      }
    }
    d->d = pQVar4;
  }
  (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar6 & 0xffffff06 | uVar8 << 4;
  d->d->m_offsetFromUtc = iVar7;
LAB_0012d805:
  if (1 < uVar8 - 1) {
    resolve_00.i = 0;
    if (resolve - LegacyBehavior < 6) {
      resolve_00.i = *(Int *)(&DAT_0017cd5c + (ulong)(resolve - LegacyBehavior) * 4);
    }
    refreshZonedDateTime(d,zone,(TransitionOptions)resolve_00.i);
    return;
  }
  refreshSimpleDateTime(d);
  return;
}

Assistant:

static void reviseTimeZone(QDateTimeData &d, const QTimeZone &zone,
                           QDateTime::TransitionResolution resolve)
{
    Qt::TimeSpec spec = zone.timeSpec();
    auto status = mergeSpec(getStatus(d), spec);
    bool reuse = d.isShort();
    int offset = 0;

    switch (spec) {
    case Qt::UTC:
        Q_ASSERT(zone.fixedSecondsAheadOfUtc() == 0);
        break;
    case Qt::OffsetFromUTC:
        reuse = false;
        offset = zone.fixedSecondsAheadOfUtc();
        Q_ASSERT(offset);
        break;
    case Qt::TimeZone:
        reuse = false;
        break;
    case Qt::LocalTime:
        break;
    }

    status &= ~(QDateTimePrivate::ValidDateTime | QDateTimePrivate::DaylightMask);
    if (reuse) {
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_offsetFromUtc = offset;
#if QT_CONFIG(timezone)
        if (spec == Qt::TimeZone)
            d->m_timeZone = zone;
#endif // timezone
    }

    if (QTimeZone::isUtcOrFixedOffset(spec))
        refreshSimpleDateTime(d);
    else
        refreshZonedDateTime(d, zone, toTransitionOptions(resolve));
}